

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

GeneratedCodeInfo_Annotation *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::GeneratedCodeInfo_Annotation>
          (Arena *arena)

{
  GeneratedCodeInfo_Annotation *this;
  
  if (arena == (Arena *)0x0) {
    this = (GeneratedCodeInfo_Annotation *)operator_new(0x40);
    GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation(this);
  }
  else {
    AllocHook(arena,(type_info *)&GeneratedCodeInfo_Annotation::typeinfo,0x40);
    this = (GeneratedCodeInfo_Annotation *)AllocateAlignedNoHook(arena,0x40);
    GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::GeneratedCodeInfo_Annotation* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::GeneratedCodeInfo_Annotation >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::GeneratedCodeInfo_Annotation >(arena);
}